

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_socket(Curl_multi *multi,curl_socket_t s,int *running_handles)

{
  CURLMcode CVar1;
  
  CVar1 = CURLM_RECURSIVE_API_CALL;
  if (multi->in_callback == false) {
    CVar1 = multi_socket(multi,false,s,0,running_handles);
    if (CVar1 < CURLM_BAD_HANDLE) {
      CVar1 = Curl_update_timer(multi);
      return CVar1;
    }
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_socket(struct Curl_multi *multi, curl_socket_t s,
                            int *running_handles)
{
  CURLMcode result;
  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;
  result = multi_socket(multi, FALSE, s, 0, running_handles);
  if(CURLM_OK >= result)
    result = Curl_update_timer(multi);
  return result;
}